

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(CategoricalMapping *a,CategoricalMapping *b)

{
  uint32 uVar1;
  bool bVar2;
  StringToInt64Map *pSVar3;
  StringToInt64Map *pSVar4;
  Int64ToStringMap *pIVar5;
  Int64ToStringMap *pIVar6;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 == b->_oneof_case_[0]) {
    if (uVar1 != 0) {
      if (uVar1 == 1) {
        pSVar3 = CategoricalMapping::stringtoint64map(a);
        pSVar4 = CategoricalMapping::stringtoint64map(b);
        bVar2 = operator==(&(pSVar3->map_).map_,&(pSVar4->map_).map_);
        return bVar2;
      }
      pIVar5 = CategoricalMapping::int64tostringmap(a);
      pIVar6 = CategoricalMapping::int64tostringmap(b);
      bVar2 = operator==(&(pIVar5->map_).map_,&(pIVar6->map_).map_);
      return bVar2;
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const NeuralNetworkImageScaler& a,
                        const NeuralNetworkImageScaler& b) {
            if (a.redbias() != b.redbias()) {
                return false;
            }
            if (a.bluebias() != b.bluebias()) {
                return false;
            }
            if (a.greenbias() != b.greenbias()) {
                return false;
            }
            if (a.graybias() != b.graybias()) {
                return false;
            }
            if (a.channelscale() != b.channelscale()) {
                return false;
            }
            return true;
        }